

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMImplementationImpl.cpp
# Opt level: O0

DOMLSParser * __thiscall
xercesc_4_0::DOMImplementationImpl::createLSParser
          (DOMImplementationImpl *this,DOMImplementationLSMode mode,XMLCh *param_2,
          MemoryManager *manager,XMLGrammarPool *gramPool)

{
  DOMException *this_00;
  DOMLSParserImpl *this_01;
  DOMLSParser *local_60;
  XMLGrammarPool *gramPool_local;
  MemoryManager *manager_local;
  XMLCh *param_2_local;
  DOMImplementationLSMode mode_local;
  DOMImplementationImpl *this_local;
  
  if (mode == MODE_ASYNCHRONOUS) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,9,0,manager);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  this_01 = (DOMLSParserImpl *)XMemory::operator_new(0x128,manager);
  DOMLSParserImpl::DOMLSParserImpl(this_01,(XMLValidator *)0x0,manager,gramPool);
  local_60 = (DOMLSParser *)0x0;
  if (this_01 != (DOMLSParserImpl *)0x0) {
    local_60 = &this_01->super_DOMLSParser;
  }
  return local_60;
}

Assistant:

DOMLSParser* DOMImplementationImpl::createLSParser( const DOMImplementationLSMode   mode,
                                                    const XMLCh* const     /*schemaType*/,
                                                    MemoryManager* const  manager,
                                                    XMLGrammarPool* const gramPool)
{
    if (mode == DOMImplementationLS::MODE_ASYNCHRONOUS)
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, manager);

    // TODO: schemaType
    return new (manager) DOMLSParserImpl(0, manager, gramPool);
}